

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Householder.h
# Opt level: O3

void __thiscall
Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>>::
applyHouseholderOnTheRight<Eigen::Matrix<double,1,1,0,1,1>>
          (MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>> *this,
          Matrix<double,_1,_1,_0,_1,_1> *essential,Scalar *tau,Scalar *workspace)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  SrcEvaluatorType *pSVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  XprTypeNested pMVar8;
  long lVar9;
  char *pcVar10;
  long *plVar11;
  SrcEvaluatorType *pSVar12;
  SrcEvaluatorType *pSVar13;
  variable_if_dynamic<long,__1> *pvVar14;
  SrcEvaluatorType *pSVar15;
  long lVar16;
  XprTypeNested pMVar17;
  ActualDstType actualDst;
  Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_> tmp;
  DstEvaluatorType dstEvaluator_1;
  SrcEvaluatorType srcEvaluator;
  DstEvaluatorType dstEvaluator;
  assign_op<double,_double> local_181;
  undefined1 local_180 [24];
  DstEvaluatorType local_168;
  undefined1 local_150 [16];
  variable_if_dynamic<long,__1> local_140;
  scalar_constant_op<double> local_138;
  variable_if_dynamic<long,__1> local_130;
  variable_if_dynamic<long,__1> local_128;
  undefined1 local_120;
  undefined7 uStack_11f;
  type local_110;
  scalar_constant_op<double> local_100;
  Scalar *local_f0;
  Matrix<double,_1,_1,_0,_1,_1> *local_e8;
  variable_if_dynamic<long,__1> local_e0;
  RhsEtorType local_d8;
  Index local_d0;
  Matrix<double,_1,_1,_0,_1,_1> *local_c8;
  undefined8 local_c0;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>
  local_b8;
  DstXprType local_98;
  
  if (*(long *)(this + 0x10) == 1) {
    if (*(long *)(this + 8) < 0) {
      pcVar10 = 
      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, -1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, -1>]"
      ;
LAB_0011dfae:
      __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/CwiseNullaryOp.h"
                    ,0x4a,pcVar10);
    }
    local_b8.m_dst = (DstEvaluatorType *)(1.0 - *tau);
    local_150._8_8_ = &local_b8;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_0>
    .m_data = *(PointerType *)this;
    local_150._0_8_ = &local_98;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_0>
    ._16_8_ = *(undefined8 *)(*(long *)(this + 0x18) + 8);
    local_140.m_value = (long)&local_168;
    local_138.m_other = (double)this;
    internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>,_4,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::mul_assign_op<double,_double>,_0>
           *)local_150);
  }
  else if ((*tau != 0.0) || (NAN(*tau))) {
    pSVar4 = *(SrcEvaluatorType **)(this + 8);
    local_180._0_8_ = workspace;
    local_180._8_8_ = pSVar4;
    if ((long)pSVar4 < 0) {
      __assert_fail("vecSize >= 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xa6,
                    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
                   );
    }
    pMVar17 = (XprTypeNested)(*(long *)(*(long *)(this + 0x18) + 8) * 8 + *(long *)this);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_0>
    .m_data = (PointerType)pMVar17;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
    .
    super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_0>
    .m_rows.m_value = (long)pSVar4;
    if (*(long *)(this + 0x10) != 2) {
      __assert_fail("v == T(Value)",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/XprHelper.h"
                    ,0x85,
                    "Eigen::internal::variable_if_dynamic<long, 1>::variable_if_dynamic(T) [T = long, Value = 1]"
                   );
    }
    pMVar8 = *(XprTypeNested *)(this + 0x18);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_cols.
    m_value = *(long *)(this + 0x10);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_xpr =
         pMVar8;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    m_outerStride = *(Index *)(this + 0x30);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startRow.
    m_value = *(long *)(this + 0x20);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.m_startCol.
    m_value = *(long *)(this + 0x28);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_data =
         *(PointerType *)this;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_xpr.super_BlockImpl<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_Eigen::Dense>.
    super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false,_true>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_1>.
    super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_0>.m_rows.
    m_value = *(long *)(this + 8);
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_startRow.m_value = 0;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_startCol.m_value = 1;
    local_98.
    super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
    .
    super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .m_outerStride =
         (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
    ;
    plVar11 = (long *)&local_98.
                       super_BlockImpl<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_Eigen::Dense>
                       .
                       super_BlockImpl_dense<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_1>
                       .
                       super_MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_0>
                       .field_0x10;
    pvVar14 = &local_140;
    for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
      pvVar14->m_value = *plVar11;
      plVar11 = plVar11 + 1;
      pvVar14 = pvVar14 + 1;
    }
    local_d0 = *(Index *)(CONCAT71(uStack_11f,local_120) + 8);
    local_c0 = 1;
    local_b8.m_dst = &local_168;
    local_b8.m_src = (SrcEvaluatorType *)local_150;
    local_b8.m_functor = (sub_assign_op<double,_double> *)&local_181;
    local_b8.m_dstExpr = (DstXprType *)local_180;
    local_168.
    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
    .m_data = workspace;
    local_168.
    super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
    .
    super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
    .m_outerStride.m_value = (long)pSVar4;
    local_150._0_8_ = pMVar17;
    local_150._8_8_ = pSVar4;
    local_e8 = essential;
    local_e0.m_value = (long)pMVar17;
    local_c8 = essential;
    internal::
    dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>,_3,_0>
    ::run((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,_1,_1,_0,_1,_1>,_1>_>,_Eigen::internal::assign_op<double,_double>,_0>
           *)&local_b8);
    lVar9 = *(long *)this;
    pSVar15 = *(SrcEvaluatorType **)(this + 8);
    if ((long)pSVar15 < 0 && lVar9 != 0) {
LAB_0011df44:
      __assert_fail("(dataPtr == 0) || ( rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/MapBase.h"
                    ,0xb2,
                    "Eigen::MapBase<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, 0>::MapBase(PointerType, Index, Index) [Derived = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Level = 0]"
                   );
    }
    if (*(long *)(this + 0x10) < 1) {
LAB_0011df63:
      __assert_fail("(i>=0) && ( ((BlockRows==1) && (BlockCols==XprType::ColsAtCompileTime) && i<xpr.rows()) ||((BlockRows==XprType::RowsAtCompileTime) && (BlockCols==1) && i<xpr.cols()))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                    ,0x7a,
                    "Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>::Block(XprType &, Index) [XprType = Eigen::Block<Eigen::Matrix<double, -1, -1>>, BlockRows = -1, BlockCols = 1, InnerPanel = true]"
                   );
    }
    if ((SrcEvaluatorType *)local_180._8_8_ != pSVar15) {
      pcVar10 = 
      "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Map<Eigen::Matrix<double, -1, 1>>, SrcXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, Functor = Eigen::internal::add_assign_op<double, double>]"
      ;
LAB_0011e022:
      __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                    "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/AssignEvaluator.h"
                    ,0x2f2,pcVar10);
    }
    pSVar13 = pSVar15;
    if (((local_180._0_8_ & 7) == 0) &&
       (pSVar13 = (SrcEvaluatorType *)(ulong)((uint)((ulong)local_180._0_8_ >> 3) & 1),
       (long)pSVar15 <= (long)pSVar13)) {
      pSVar13 = pSVar15;
    }
    lVar16 = (long)pSVar15 - (long)pSVar13;
    if (0 < (long)pSVar13) {
      pSVar12 = (SrcEvaluatorType *)0x0;
      do {
        *(double *)(local_180._0_8_ + pSVar12 * 8) =
             *(double *)(lVar9 + (long)pSVar12 * 8) + *(double *)(local_180._0_8_ + pSVar12 * 8);
        pSVar12 = (SrcEvaluatorType *)((long)&(pSVar12->m_functor).m_other + 1);
      } while (pSVar13 != pSVar12);
    }
    pSVar12 = (SrcEvaluatorType *)
              ((long)&(pSVar13->m_functor).m_other +
              (lVar16 - (lVar16 >> 0x3f) & 0xfffffffffffffffeU));
    if (1 < lVar16) {
      do {
        pdVar1 = (double *)(lVar9 + (long)pSVar13 * 8);
        dVar6 = pdVar1[1];
        dVar3 = ((double *)(local_180._0_8_ + pSVar13 * 8))[1];
        *(Scalar *)(local_180._0_8_ + pSVar13 * 8) =
             *pdVar1 + *(double *)(local_180._0_8_ + pSVar13 * 8);
        ((Scalar *)(local_180._0_8_ + pSVar13 * 8))[1] = dVar6 + dVar3;
        pSVar13 = (SrcEvaluatorType *)((long)&(pSVar13->m_functor).m_other + 2);
      } while ((long)pSVar13 < (long)pSVar12);
    }
    if ((long)pSVar12 < (long)pSVar15) {
      do {
        *(double *)(local_180._0_8_ + pSVar12 * 8) =
             *(double *)(lVar9 + (long)pSVar12 * 8) + *(double *)(local_180._0_8_ + pSVar12 * 8);
        pSVar12 = (SrcEvaluatorType *)((long)&(pSVar12->m_functor).m_other + 1);
      } while (pSVar15 != pSVar12);
    }
    if (-1 < (long)local_180._8_8_) {
      uVar5 = *(ulong *)this;
      if ((long)*(SrcEvaluatorType **)(this + 8) < 0 && uVar5 != 0) goto LAB_0011df44;
      if (*(long *)(this + 0x10) < 1) goto LAB_0011df63;
      if (*(SrcEvaluatorType **)(this + 8) != (SrcEvaluatorType *)local_180._8_8_) {
        pcVar10 = 
        "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const Functor &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1, true>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Functor = Eigen::internal::sub_assign_op<double, double>]"
        ;
        goto LAB_0011e022;
      }
      pSVar15 = (SrcEvaluatorType *)local_180._8_8_;
      if (((uVar5 & 7) == 0) &&
         (pSVar15 = (SrcEvaluatorType *)(ulong)((uint)(uVar5 >> 3) & 1),
         (ulong)local_180._8_8_ <= pSVar15)) {
        pSVar15 = (SrcEvaluatorType *)local_180._8_8_;
      }
      dVar3 = *tau;
      lVar9 = local_180._8_8_ - (long)pSVar15;
      if (pSVar15 != (SrcEvaluatorType *)0x0) {
        pSVar13 = (SrcEvaluatorType *)0x0;
        do {
          *(double *)(uVar5 + (long)pSVar13 * 8) =
               *(double *)(uVar5 + (long)pSVar13 * 8) -
               *(double *)(local_180._0_8_ + pSVar13 * 8) * dVar3;
          pSVar13 = (SrcEvaluatorType *)((long)&(pSVar13->m_functor).m_other + 1);
        } while (pSVar15 != pSVar13);
      }
      pSVar13 = (SrcEvaluatorType *)
                ((long)&(pSVar15->m_functor).m_other +
                (lVar9 - (lVar9 >> 0x3f) & 0xfffffffffffffffeU));
      if (1 < lVar9) {
        do {
          dVar6 = ((double *)(local_180._0_8_ + pSVar15 * 8))[1];
          pdVar1 = (double *)(uVar5 + (long)pSVar15 * 8);
          dVar7 = pdVar1[1];
          pdVar2 = (double *)(uVar5 + (long)pSVar15 * 8);
          *pdVar2 = *pdVar1 - *(double *)(local_180._0_8_ + pSVar15 * 8) * dVar3;
          pdVar2[1] = dVar7 - dVar6 * dVar3;
          pSVar15 = (SrcEvaluatorType *)((long)&(pSVar15->m_functor).m_other + 2);
        } while ((long)pSVar15 < (long)pSVar13);
      }
      if ((long)pSVar13 < (long)local_180._8_8_) {
        do {
          *(double *)(uVar5 + (long)pSVar13 * 8) =
               *(double *)(uVar5 + (long)pSVar13 * 8) -
               *(double *)(local_180._0_8_ + pSVar13 * 8) * dVar3;
          pSVar13 = (SrcEvaluatorType *)((long)&(pSVar13->m_functor).m_other + 1);
        } while ((SrcEvaluatorType *)local_180._8_8_ != pSVar13);
      }
      if (-1 < (long)local_180._8_8_) {
        if (pSVar4 == (SrcEvaluatorType *)local_180._8_8_) {
          local_138.m_other = *tau;
          local_130.m_value = local_180._0_8_;
          local_120 = local_180[0x10];
          local_f0 = (Scalar *)local_180._0_8_;
          local_d0 = 1;
          local_168.
          super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
          .
          super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_outerStride.m_value =
               (pMVar8->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
               m_rows;
          local_b8.m_dst = &local_168;
          local_b8.m_src = (SrcEvaluatorType *)local_150;
          local_b8.m_functor = (sub_assign_op<double,_double> *)&local_181;
          local_b8.m_dstExpr = &local_98;
          local_168.
          super_block_evaluator<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false,_true>
          .
          super_mapbase_evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,__1,_1,_false>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
          .m_data = (PointerType)pMVar17;
          local_150._8_8_ = pSVar4;
          local_128.m_value = (long)pSVar4;
          local_110.m_matrix = essential;
          local_100.m_other = local_138.m_other;
          local_e0.m_value = (long)pSVar4;
          local_d8.
          super_unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
          .m_argImpl.super_evaluator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>.m_d.data =
               (unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
                )(unary_evaluator<Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_Eigen::internal::IndexBased,_double>
                  )essential;
          internal::
          dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Map<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::Stride<0,_0>_>_>,_Eigen::Transpose<const_Eigen::Matrix<double,_1,_1,_0,_1,_1>_>,_1>_>,_Eigen::internal::sub_assign_op<double,_double>,_0>,_3,_0>
          ::run(&local_b8);
          return;
        }
        __assert_fail("dst.rows() == src.rows() && dst.cols() == src.cols()",
                      "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/ProductEvaluators.h"
                      ,0xb0,
                      "static void Eigen::internal::Assignment<Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Eigen::Transpose<const Eigen::Matrix<double, 1, 1>>>, Eigen::internal::sub_assign_op<double, double>>::run(DstXprType &, const SrcXprType &, const internal::sub_assign_op<Scalar, Scalar> &) [DstXprType = Eigen::Block<Eigen::Block<Eigen::Matrix<double, -1, -1>>, -1, 1>, SrcXprType = Eigen::Product<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double>, const Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>, const Eigen::Map<Eigen::Matrix<double, -1, 1>>>, Eigen::Transpose<const Eigen::Matrix<double, 1, 1>>>, Functor = Eigen::internal::sub_assign_op<double, double>, Kind = Eigen::internal::Dense2Dense, EnableIf = void]"
                     );
      }
    }
    pcVar10 = 
    "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, const Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = const Eigen::Matrix<double, -1, 1>]"
    ;
    goto LAB_0011dfae;
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC
void MatrixBase<Derived>::applyHouseholderOnTheRight(
  const EssentialPart& essential,
  const Scalar& tau,
  Scalar* workspace)
{
  if(cols() == 1)
  {
    *this *= Scalar(1)-tau;
  }
  else if(tau!=Scalar(0))
  {
    Map<typename internal::plain_col_type<PlainObject>::type> tmp(workspace,rows());
    Block<Derived, Derived::RowsAtCompileTime, EssentialPart::SizeAtCompileTime> right(derived(), 0, 1, rows(), cols()-1);
    tmp.noalias() = right * essential;
    tmp += this->col(0);
    this->col(0) -= tau * tmp;
    right.noalias() -= tau * tmp * essential.adjoint();
  }
}